

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_758de6::HandleReadSymlinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  Status SVar1;
  bool bVar2;
  string_view value;
  string result;
  string local_60;
  string local_40;
  
  a = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)a == 0x60) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    SVar1 = cmsys::SystemTools::ReadSymlink(a + 1,&local_60);
    bVar2 = SVar1.Kind_ == Success;
    if (bVar2) {
      value._M_str = local_60._M_dataplus._M_p;
      value._M_len = local_60._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,a + 2,value);
    }
    else {
      cmStrCat<char_const(&)[57],std::__cxx11::string_const&>
                (&local_40,
                 (char (*) [57])"READ_SYMLINK requested of path that is not a symlink:\n  ",a + 1);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[42]>(&local_60,a,(char (*) [42])0x6ab32d);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_60);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HandleReadSymlinkCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  const std::string& filename = args[1];
  const std::string& outputVariable = args[2];

  std::string result;
  if (!cmSystemTools::ReadSymlink(filename, result)) {
    status.SetError(cmStrCat(
      "READ_SYMLINK requested of path that is not a symlink:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(outputVariable, result);

  return true;
}